

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O2

bool __thiscall
ON_PolyEdgeHistoryValue::ReadHelper(ON_PolyEdgeHistoryValue *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  ON_PolyEdgeHistory *this_00;
  byte bVar2;
  int iVar3;
  ON_ClassArray<ON_PolyEdgeHistory> *this_01;
  int count;
  int minor_version;
  int major_version;
  
  this_01 = &this->m_value;
  ON_ClassArray<ON_PolyEdgeHistory>::Destroy(this_01);
  major_version = 0;
  minor_version = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&major_version,&minor_version);
  if (bVar1) {
    count = 0;
    bVar1 = ON_BinaryArchive::ReadInt(archive,&count);
    if (bVar1) {
      ON_ClassArray<ON_PolyEdgeHistory>::Reserve(this_01,(long)count);
      iVar3 = -1;
      do {
        iVar3 = iVar3 + 1;
        if (count <= iVar3) {
          bVar2 = 1;
          goto LAB_0056665b;
        }
        this_00 = ON_ClassArray<ON_PolyEdgeHistory>::AppendNew(this_01);
        bVar1 = ON_PolyEdgeHistory::Read(this_00,archive);
      } while (bVar1);
      ON_ClassArray<ON_PolyEdgeHistory>::Destroy(this_01);
    }
    bVar2 = 0;
LAB_0056665b:
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(archive);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_PolyEdgeHistoryValue::ReadHelper(ON_BinaryArchive& archive )
{
  m_value.Destroy();

  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;

  for(;;)
  {
    int count = 0;
    rc = archive.ReadInt(&count);
    if (!rc) break;
    m_value.Reserve(count);
    
    for( int i = 0; i < count && rc; i++ )
    {
      if ( !m_value.AppendNew().Read(archive) )
      {
        m_value.Destroy();
        rc = false;
        break;
      }
    }
    if (!rc) break;

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}